

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,realtype tol,
              int callLSetup,void *mem)

{
  long *plVar1;
  N_Vector x;
  undefined8 *puVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  
  auVar8._0_4_ = -(uint)(NLS == (SUNNonlinearSolver)0x0);
  auVar8._4_4_ = -(uint)(y0 == (N_Vector)0x0);
  auVar8._8_4_ = -(uint)(ycor == (N_Vector)0x0);
  auVar8._12_4_ = -(uint)(w == (N_Vector)0x0);
  iVar5 = movmskps((int)w,auVar8);
  iVar4 = -0x385;
  if ((((iVar5 == 0 && mem != (void *)0x0) && (plVar1 = (long *)NLS->content, *plVar1 != 0)) &&
      (plVar1[2] != 0)) &&
     (((bVar7 = callLSetup == 0, bVar7 || (plVar1[1] != 0)) && (plVar1[3] != 0)))) {
    x = (N_Vector)plVar1[4];
    plVar1[7] = 0;
    plVar1[8] = 0;
    iVar4 = (**NLS->content)(ycor,x,mem);
    if (iVar4 == 0) {
      uVar6 = 0;
      while ((bVar7 || (iVar4 = (**(code **)((long)NLS->content + 8))
                                          (uVar6,(long)NLS->content + 0x28,mem), iVar4 == 0))) {
        *(undefined4 *)((long)NLS->content + 0x2c) = 0;
        do {
          plVar1 = (long *)((long)NLS->content + 0x38);
          *plVar1 = *plVar1 + 1;
          N_VScale(-1.0,x,x);
          iVar4 = (**(code **)((long)NLS->content + 0x10))(x,mem);
          if (iVar4 != 0) break;
          N_VLinearSum(1.0,ycor,1.0,x,ycor);
          iVar4 = (**(code **)((long)NLS->content + 0x18))
                            (SUB84(tol,0),NLS,ycor,x,w,*(undefined8 *)((long)NLS->content + 0x48));
          if (iVar4 != 0x385) {
            if (iVar4 == 0) {
              *(undefined4 *)((long)NLS->content + 0x28) = 0;
              return 0;
            }
            break;
          }
          puVar2 = (undefined8 *)NLS->content;
          iVar4 = *(int *)((long)puVar2 + 0x2c) + 1;
          *(int *)((long)puVar2 + 0x2c) = iVar4;
          if (*(int *)(puVar2 + 6) <= iVar4) {
            iVar4 = 0x386;
            break;
          }
          iVar4 = (*(code *)*puVar2)(ycor,x,mem);
        } while (iVar4 == 0);
        if (((iVar4 < 1) || (pvVar3 = NLS->content, *(int *)((long)pvVar3 + 0x28) != 0)) ||
           (*(long *)((long)pvVar3 + 8) == 0)) break;
        *(long *)((long)pvVar3 + 0x40) = *(long *)((long)pvVar3 + 0x40) + 1;
        N_VConst(0.0,ycor);
        iVar4 = (**NLS->content)(ycor,x,mem);
        uVar6 = 1;
        bVar7 = false;
        if (iVar4 != 0) break;
      }
    }
    plVar1 = (long *)((long)NLS->content + 0x40);
    *plVar1 = *plVar1 + 1;
  }
  return iVar4;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             N_Vector y0, N_Vector ycor,
                             N_Vector w, realtype tol,
                             booleantype callLSetup, void* mem)
{
  /* local variables */
  int retval;
  booleantype jbad;
  N_Vector delta;

  /* check that the inputs are non-null */
  if ( (NLS  == NULL) ||
       (y0   == NULL) ||
       (ycor == NULL) ||
       (w    == NULL) ||
       (mem  == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (NEWTON_CONTENT(NLS)->Sys    == NULL) ||
       (NEWTON_CONTENT(NLS)->LSolve == NULL) ||
       (callLSetup && (NEWTON_CONTENT(NLS)->LSetup == NULL)) ||
       (NEWTON_CONTENT(NLS)->CTest  == NULL) ) {
    return(SUN_NLS_MEM_NULL);
  }

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* initialize iteration and convergence fail counters for this solve */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Preform Newton iteraion */
  for(;;) {

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* if indicated, setup the linear system */
    if (callLSetup) {
      retval = NEWTON_CONTENT(NLS)->LSetup(jbad,
                                           &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_NLS_SUCCESS) break;
    }

    /* initialize current iteration counter for this solve attempt */
    NEWTON_CONTENT(NLS)->curiter = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    /* print current iteration number and the nonlinear residual */
    if (NEWTON_CONTENT(NLS)->print_level && NEWTON_CONTENT(NLS)->info_file
        && (NEWTON_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
    {
      fprintf(NEWTON_CONTENT(NLS)->info_file,
              "SUNNONLINSOL_NEWTON (nni=%ld):\n",
              (long int) NEWTON_CONTENT(NLS)->niters);
    }
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
      "SUNNonlinSolSolve_Newton", "begin-iteration",
      "iter = %ld, nni = %ld", (long int) 0, NEWTON_CONTENT(NLS)->niters);
#endif

    /* looping point for Newton iteration. Break out on any error. */
    for(;;) {

      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

      /* update the Newton iterate */
      N_VLinearSum(ONE, ycor, ONE, delta, ycor);

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                          NEWTON_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      /* print current iteration number and the nonlinear residual */
      if (NEWTON_CONTENT(NLS)->print_level && NEWTON_CONTENT(NLS)->info_file
          && (NEWTON_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
      {
        fprintf(NEWTON_CONTENT(NLS)->info_file,
                "SUNNONLINSOL_NEWTON (nni=%ld):\n",
                (long int) NEWTON_CONTENT(NLS)->niters);
      }
      SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
        "SUNNonlinSolSolve_Newton", "end-of-iterate",
        "iter = %ld, nni = %ld, wrmsnorm = %.16g", NEWTON_CONTENT(NLS)->curiter,
        NEWTON_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

      /* if successful update Jacobian status and return */
      if (retval == SUN_NLS_SUCCESS) {
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return(SUN_NLS_SUCCESS);
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) break;

      /* not yet converged. Increment curiter and test for max allowed. */
      NEWTON_CONTENT(NLS)->curiter++;
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters) {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

    } /* end of Newton iteration loop */

    /* all errors go here */

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count,
       reset the initial correction to zero, and loop again with a call to
       lsetup in which jbad is TRUE. Otherwise break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) && (NEWTON_CONTENT(NLS)->LSetup)) {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad = SUNTRUE;
      N_VConst(ZERO, ycor);
      continue;
    } else {
      break;
    }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return(retval);
}